

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_draw_command * nk__draw_list_end(nk_draw_list *canvas,nk_buffer *buffer)

{
  if (buffer == (nk_buffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x23ee,
                  "const struct nk_draw_command *nk__draw_list_end(const struct nk_draw_list *, const struct nk_buffer *)"
                 );
  }
  if (canvas != (nk_draw_list *)0x0) {
    return (nk_draw_command *)
           ((long)(buffer->memory).ptr +
           (ulong)(canvas->cmd_count - 1) * -0x20 + ((buffer->memory).size - canvas->cmd_offset));
  }
  __assert_fail("canvas",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x23ef,
                "const struct nk_draw_command *nk__draw_list_end(const struct nk_draw_list *, const struct nk_buffer *)"
               );
}

Assistant:

NK_API const struct nk_draw_command*
nk__draw_list_end(const struct nk_draw_list *canvas, const struct nk_buffer *buffer)
{
    nk_size size;
    nk_size offset;
    nk_byte *memory;
    const struct nk_draw_command *end;

    NK_ASSERT(buffer);
    NK_ASSERT(canvas);
    if (!buffer || !canvas)
        return 0;

    memory = (nk_byte*)buffer->memory.ptr;
    size = buffer->memory.size;
    offset = size - canvas->cmd_offset;
    end = nk_ptr_add(const struct nk_draw_command, memory, offset);
    end -= (canvas->cmd_count-1);
    return end;
}